

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

bool __thiscall
SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>::Prepend
          (SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
           *this,NoCheckHeapAllocator *allocator,RangeUnit<Js::SourceFunctionNode> *data)

{
  SourceFunctionNode SVar1;
  Type pSVar2;
  
  pSVar2 = (Type)Memory::NoCheckHeapAllocator::Alloc(allocator,0x18);
  SVar1 = data->j;
  *(SourceFunctionNode *)(pSVar2 + 1) = data->i;
  *(SourceFunctionNode *)(pSVar2 + 2) = SVar1;
  pSVar2->next = (this->super_SListNodeBase<Memory::NoCheckHeapAllocator>).next;
  (this->super_SListNodeBase<Memory::NoCheckHeapAllocator>).next = pSVar2;
  (this->super_RealCount).count = (this->super_RealCount).count + 1;
  return true;
}

Assistant:

bool Prepend(TAllocator * allocator, TData const& data)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, data);
        if (newNode)
        {
            newNode->Next() = this->Next();
            this->Next() = newNode;
            this->IncrementCount();
            return true;
        }
        return false;
    }